

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O1

void UnitTests::stream_any_details::output_unsigned<unsigned_long>
               (ostream *s,unsigned_long *t,int width)

{
  long lVar1;
  ostream oVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"0x",2);
  lVar1 = *(long *)s;
  *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(long *)(s + *(long *)(lVar1 + -0x18) + 0x10) = (long)width;
  *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x10;
  poVar3 = s + *(long *)(lVar1 + -0x18);
  if (s[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar3);
    poVar3[0xe0] = oVar2;
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x30;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)s);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void output_unsigned(std::ostream& s, const T& t, int width)
        {
            s << "0x" << std::hex << std::setw(width) << std::internal << std::setfill('0') << t << std::dec;
        }